

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall ON_BinaryArchive::WriteArray(ON_BinaryArchive *this,int count,ON_Layer **a)

{
  bool bVar1;
  ulong uVar2;
  uint local_2c;
  
  if (count < 1) {
    count = 0;
  }
  if (a == (ON_Layer **)0x0) {
    count = 0;
  }
  uVar2 = 1;
  local_2c = count;
  bVar1 = WriteInt32(this,1,(ON__INT32 *)&local_2c);
  if (count != 0 && bVar1) {
    do {
      bVar1 = WriteObject(this,(ON_Object *)a[uVar2 - 1]);
      if ((uint)count <= uVar2) {
        return bVar1;
      }
      uVar2 = uVar2 + 1;
    } while (bVar1);
  }
  return bVar1;
}

Assistant:

bool ON_BinaryArchive::WriteArray( int count, const ON_Layer*const* a)
{
  int i;
  if ( count < 0 || 0 == a )
    count = 0;
  bool rc = WriteInt( count );
  for  ( i = 0; i < count && rc; i++ )
  {
    rc = WriteObject(a[i]);
  }
  return rc;
}